

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Program.cpp
# Opt level: O0

bool __thiscall
llvm::sys::commandLineFitsWithinSystemLimits
          (sys *this,StringRef Program,ArrayRef<const_char_*> Args)

{
  StringRef Program_00;
  bool bVar1;
  size_t N;
  ArrayRef<llvm::StringRef> local_f8;
  sys *local_e8;
  char *local_e0;
  char *local_d8;
  char *A;
  iterator __end1;
  iterator __begin1;
  ArrayRef<const_char_*> *__range1;
  SmallVector<llvm::StringRef,_8U> StringRefArgs;
  ArrayRef<const_char_*> Args_local;
  StringRef Program_local;
  
  StringRefArgs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
  super_AlignedCharArray<8UL,_16UL>.buffer._8_8_ = Program.Length;
  SmallVector<llvm::StringRef,_8U>::SmallVector((SmallVector<llvm::StringRef,_8U> *)&__range1);
  N = ArrayRef<const_char_*>::size
                ((ArrayRef<const_char_*> *)
                 (StringRefArgs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
                  super_AlignedCharArray<8UL,_16UL>.buffer + 8));
  SmallVectorImpl<llvm::StringRef>::reserve((SmallVectorImpl<llvm::StringRef> *)&__range1,N);
  __begin1 = (iterator)
             (StringRefArgs.super_SmallVectorStorage<llvm::StringRef,_8U>.InlineElts[7].
              super_AlignedCharArray<8UL,_16UL>.buffer + 8);
  __end1 = ArrayRef<const_char_*>::begin((ArrayRef<const_char_*> *)__begin1);
  A = (char *)ArrayRef<const_char_*>::end((ArrayRef<const_char_*> *)__begin1);
  for (; __end1 != (iterator)A; __end1 = __end1 + 1) {
    local_d8 = *__end1;
    SmallVectorImpl<llvm::StringRef>::emplace_back<char_const*&>
              ((SmallVectorImpl<llvm::StringRef> *)&__range1,&local_d8);
  }
  local_e8 = this;
  local_e0 = Program.Data;
  ArrayRef<llvm::StringRef>::ArrayRef<void>
            (&local_f8,(SmallVectorTemplateCommon<llvm::StringRef,_void> *)&__range1);
  Program_00.Length = (size_t)local_e0;
  Program_00.Data = (char *)local_e8;
  bVar1 = commandLineFitsWithinSystemLimits(Program_00,local_f8);
  SmallVector<llvm::StringRef,_8U>::~SmallVector((SmallVector<llvm::StringRef,_8U> *)&__range1);
  return bVar1;
}

Assistant:

bool sys::commandLineFitsWithinSystemLimits(StringRef Program,
                                            ArrayRef<const char *> Args) {
  SmallVector<StringRef, 8> StringRefArgs;
  StringRefArgs.reserve(Args.size());
  for (const char *A : Args)
    StringRefArgs.emplace_back(A);
  return commandLineFitsWithinSystemLimits(Program, StringRefArgs);
}